

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionEvaluator.cpp
# Opt level: O3

void __thiscall OpenMD::SelectionEvaluator::define(SelectionEvaluator *this)

{
  long *plVar1;
  string variable;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  SelectionSet local_60;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
  local_48;
  
  plVar1 = (long *)std::__any_caster<std::__cxx11::string>
                             (&(this->statement).
                               super__Vector_base<OpenMD::Token,_std::allocator<OpenMD::Token>_>.
                               _M_impl.super__Vector_impl_data._M_start[1].value);
  if (plVar1 != (long *)0x0) {
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_80,*plVar1,plVar1[1] + *plVar1);
    expression(&local_60,this,&this->statement,2);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_OpenMD::SelectionSet,_true>
              (&local_48,&local_80,&local_60);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::any>,std::_Select1st<std::pair<std::__cxx11::string_const,std::any>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::any>>>
    ::_M_insert_unique<std::pair<std::__cxx11::string_const,std::any>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::any>,std::_Select1st<std::pair<std::__cxx11::string_const,std::any>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::any>>>
                *)&this->variables,&local_48);
    if (local_48.second._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
      (*local_48.second._M_manager)(_Op_destroy,&local_48.second,(_Arg *)0x0);
      local_48.second._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48.first._M_dataplus._M_p != &local_48.first.field_2) {
      operator_delete(local_48.first._M_dataplus._M_p,
                      local_48.first.field_2._M_allocated_capacity + 1);
    }
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              (&local_60.bitsets_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  std::__throw_bad_any_cast();
}

Assistant:

void SelectionEvaluator::define() {
    assert(statement.size() >= 3);

    std::string variable = std::any_cast<std::string>(statement[1].value);

    variables.insert(
        VariablesType::value_type(variable, expression(statement, 2)));
  }